

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

bool __thiscall Debugger::DoEval(Debugger *this,shared_ptr<EvalContext> *evalContext)

{
  ulong uVar1;
  dll_lua_getfield p_Var2;
  dll_luaL_loadstring p_Var3;
  lua_State *plVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  element_type *peVar8;
  char *pcVar9;
  ArenaClass *pAVar10;
  element_type *peVar11;
  Variable *pVVar12;
  Idx<Variable> variable;
  Idx<Variable> variable_00;
  int fIdx;
  undefined1 local_118 [4];
  int r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator local_91;
  string local_90 [8];
  string statement;
  string local_50;
  int local_30;
  int local_2c;
  int level;
  int innerLevel;
  lua_State *L;
  shared_ptr<EvalContext> *evalContext_local;
  Debugger *this_local;
  
  if ((this->currentL == (lua_State *)0x0) ||
     (L = (lua_State *)evalContext, evalContext_local = (shared_ptr<EvalContext> *)this,
     bVar5 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)evalContext), !bVar5)) {
    this_local._7_1_ = 0;
  }
  else {
    _level = this->currentL;
    peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)evalContext);
    local_2c = peVar8->stackLevel;
    while ((_level != (lua_State *)0x0 && (local_30 = LastLevel(_level), local_30 < local_2c))) {
      local_2c = local_2c - local_30;
      _level = ExtensionPoint::QueryParentThread(&this->manager->extension,_level);
    }
    if (_level == (lua_State *)0x0) {
      this_local._7_1_ = 0;
    }
    else {
      peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)evalContext);
      if (0 < peVar8->cacheId) {
        (*lua_getfield)(_level,LUA_REGISTRYINDEX,"_emmy_cache_table_");
        iVar6 = (*lua_type)(_level,-1);
        plVar4 = _level;
        p_Var2 = lua_getfield;
        if (iVar6 == 5) {
          peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)evalContext);
          std::__cxx11::to_string(&local_50,peVar8->cacheId);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          (*p_Var2)(plVar4,-1,pcVar9);
          std::__cxx11::string::~string((string *)&local_50);
          peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)evalContext);
          pAVar10 = Idx<Variable>::GetArena(&peVar8->result);
          SetVariableArena(this,pAVar10);
          plVar4 = _level;
          peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)evalContext);
          statement.field_2._8_8_ = *(undefined8 *)&peVar8->result;
          pAVar10 = (peVar8->result)._arena;
          peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)evalContext);
          variable._0_8_ = statement.field_2._8_8_ & 0xffffffff;
          variable._arena = pAVar10;
          GetVariable(this,plVar4,variable,-1,peVar8->depth,true);
          ClearVariableArenaRef(this);
          (*lua_settop)(_level,-3);
          this_local._7_1_ = 1;
          goto LAB_001f2079;
        }
        (*lua_settop)(_level,-2);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"return ",&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)evalContext);
      if ((peVar8->setValue & 1U) == 0) {
        std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   evalContext);
        std::__cxx11::string::append(local_90);
      }
      else {
        peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)evalContext);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118,&peVar8->expr," = ");
        peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)evalContext);
        std::operator+(&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118,&peVar8->value);
        std::operator+(&local_d8,&local_f8," return ");
        peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)evalContext);
        std::operator+(&local_b8,&local_d8,&peVar8->expr);
        std::__cxx11::string::operator=(local_90,(string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)local_118);
      }
      plVar4 = _level;
      p_Var3 = luaL_loadstring;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      iVar6 = (*p_Var3)(plVar4,pcVar9);
      if (iVar6 == 3) {
        peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)evalContext);
        std::__cxx11::string::operator=((string *)&peVar8->error,"syntax err: ");
        peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)evalContext);
        std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   evalContext);
        std::__cxx11::string::append((string *)&peVar8->error);
        this_local._7_1_ = 0;
      }
      else {
        iVar6 = (*lua_gettop)(_level);
        bVar5 = CreateEnv(this,_level,local_2c);
        if (bVar5) {
          lua_setfenv(_level,iVar6);
          iVar7 = (*lua_gettop)(_level);
          if (iVar7 != iVar6) {
            __assert_fail("lua_gettop(L) == fIdx",
                          "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                          ,0x3d4,"bool Debugger::DoEval(std::shared_ptr<EvalContext>)");
          }
          iVar6 = lua_pcall(_level,0,1,0);
          if (iVar6 == 0) {
            peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)evalContext);
            peVar11 = std::
                      __shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)evalContext);
            pVVar12 = Idx<Variable>::operator->(&peVar11->result);
            std::__cxx11::string::operator=((string *)&pVVar12->name,(string *)&peVar8->expr);
            peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)evalContext);
            pAVar10 = Idx<Variable>::GetArena(&peVar8->result);
            SetVariableArena(this,pAVar10);
            plVar4 = _level;
            peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)evalContext);
            uVar1 = *(ulong *)&peVar8->result;
            pAVar10 = (peVar8->result)._arena;
            peVar8 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)evalContext);
            variable_00._0_8_ = uVar1 & 0xffffffff;
            variable_00._arena = pAVar10;
            GetVariable(this,plVar4,variable_00,-1,peVar8->depth,true);
            ClearVariableArenaRef(this);
            (*lua_settop)(_level,-2);
            this_local._7_1_ = 1;
          }
          else {
            if (iVar6 == 2) {
              pcVar9 = (*lua_tolstring)(_level,-1,(size_t *)0x0);
              peVar8 = std::
                       __shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)evalContext);
              std::__cxx11::string::operator=((string *)&peVar8->error,pcVar9);
            }
            (*lua_settop)(_level,-2);
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      std::__cxx11::string::~string(local_90);
    }
  }
LAB_001f2079:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Debugger::DoEval(std::shared_ptr<EvalContext> evalContext) {
	if (!currentL || !evalContext) {
		return false;
	}

	auto L = currentL;

	int innerLevel = evalContext->stackLevel;

	while (L != nullptr) {
		int level = LastLevel(L);
		if (innerLevel > level) {
			innerLevel -= level;
			L = manager->extension.QueryParentThread(L);
		} else {
			break;
		}
	}

	if (L == nullptr) {
		return false;
	}

	//auto* const L = L;
	// From "cacheId"
	if (evalContext->cacheId > 0) {
		lua_getfield(L, LUA_REGISTRYINDEX, CACHE_TABLE_NAME);// 1: cacheTable|nil
		if (lua_type(L, -1) == LUA_TTABLE) {
			lua_getfield(L, -1, std::to_string(evalContext->cacheId).c_str());// 1: cacheTable, 2: value
			SetVariableArena(evalContext->result.GetArena());
			GetVariable(L, evalContext->result, -1, evalContext->depth);
			ClearVariableArenaRef();
			lua_pop(L, 2);
			return true;
		}
		lua_pop(L, 1);
	}
	// LOAD AS "return expr"
	std::string statement = "return ";
	if (evalContext->setValue) {
		statement = evalContext->expr + " = " + evalContext->value + " return " + evalContext->expr;
	} else {
		statement.append(evalContext->expr);
	}

	// 如果是 aaa:bbbb 则纠正为aaa.bbbb
	int r = luaL_loadstring(L, statement.c_str());
	if (r == LUA_ERRSYNTAX) {
		evalContext->error = "syntax err: ";
		evalContext->error.append(evalContext->expr);
		return false;
	}
	// call
	const int fIdx = lua_gettop(L);
	// create env
	if (!CreateEnv(L, innerLevel))
		return false;
	// setup env
#ifndef EMMY_USE_LUA_SOURCE
	lua_setfenv(L, fIdx);
#elif defined(EMMY_LUA_51) || defined(EMMY_LUA_JIT)
    lua_setfenv(L, fIdx);
#else //52 & 53
    lua_setupvalue(L, fIdx, 1);
#endif
	assert(lua_gettop(L) == fIdx);
	// call function() return expr end
	r = lua_pcall(L, 0, 1, 0);
	if (r == LUA_OK) {
		evalContext->result->name = evalContext->expr;
		SetVariableArena(evalContext->result.GetArena());
		GetVariable(L, evalContext->result, -1, evalContext->depth);
		ClearVariableArenaRef();
		lua_pop(L, 1);
		return true;
	}
	if (r == LUA_ERRRUN) {
		evalContext->error = lua_tostring(L, -1);
	}

	lua_pop(L, 1);
	return false;
}